

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningAgent.cpp
# Opt level: O0

void __thiscall
multi_agent_planning::idp_visitor<unsigned_long>::
examine_vertex<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>const>
          (idp_visitor<unsigned_long> *this,unsigned_long u,
          adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
          *g)

{
  undefined8 uVar1;
  const_reference pvVar2;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool> local_68;
  unsigned_long local_48;
  Edge e;
  unsigned_long s;
  unsigned_long v;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
  *g_local;
  unsigned_long u_local;
  idp_visitor<unsigned_long> *this_local;
  
  if (u == this->m_goal) {
    uVar1 = __cxa_allocate_exception(1);
    __cxa_throw(uVar1,&found_goal::typeinfo,0);
  }
  *this->time = 0;
  s = u;
  while( true ) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this->p,s);
    if (s == *pvVar2) break;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this->p,s);
    e.m_eproperty = (property_type *)*pvVar2;
    boost::
    edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>>
              (&local_68,(boost *)e.m_eproperty,s,(vertex_descriptor)g,in_R8);
    local_48 = local_68.first.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    e.super_edge_base<boost::directed_tag,_unsigned_long>.m_source =
         local_68.first.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    e.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         (unsigned_long)local_68.first.m_eproperty;
    *this->time = *this->time + 1;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this->p,s);
    s = *pvVar2;
  }
  return;
}

Assistant:

void examine_vertex(Vertex u, Graph& g) {
    if(u == m_goal)
      throw found_goal();
    
    time = 0;
    for (Vertex v = u; v != p[v]; v = p[v]) {
    	Vertex s = p[v];
    	Edge e = edge(s, v, g).first;
    	time++;
    }
  }